

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O3

EC_T_DWORD
CreateLinkParmsFromCmdLine
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  char *__s1;
  int iVar1;
  EC_T_DWORD EVar2;
  EC_T_BOOL EVar3;
  EC_T_LINK_PARMS *__ptr;
  EC_T_LINK_PARMS **pbGetNextWord_00;
  EC_T_CHAR *tcStorage_00;
  EC_T_CHAR *extraout_RDX;
  EC_T_CHAR *extraout_RDX_00;
  EC_T_CHAR *extraout_RDX_01;
  EC_T_CHAR *extraout_RDX_02;
  EC_T_CHAR *extraout_RDX_03;
  EC_T_CHAR *extraout_RDX_04;
  EC_T_CHAR *tcStorage_01;
  EC_T_CHAR *tcStorage_02;
  EC_T_DWORD *lpCmdLine_00;
  EC_T_LINK_PARMS **ppLinkParms_00;
  
  __s1 = *ptcWord;
  ppLinkParms_00 = ppLinkParms;
  iVar1 = strcasecmp(__s1,"-ccat");
  if (iVar1 == 0) {
    __ptr = (EC_T_LINK_PARMS *)calloc(1,0x40);
    if (__ptr == (EC_T_LINK_PARMS *)0x0) {
      return 0x9811000a;
    }
    __ptr->dwSignature = 0xba12cab1;
    __ptr->dwSize = 0x40;
    builtin_memcpy(__ptr->szDriverIdent,"CCAT",5);
    __ptr->szDriverIdent[5] = '\0';
    __ptr->szDriverIdent[6] = '\0';
    __ptr->szDriverIdent[7] = '\0';
    __ptr->szDriverIdent[8] = '\0';
    __ptr->szDriverIdent[9] = '\0';
    __ptr->szDriverIdent[10] = '\0';
    __ptr->szDriverIdent[0xb] = '\0';
    __ptr->szDriverIdent[0xc] = '\0';
    __ptr->szDriverIdent[0xd] = '\0';
    __ptr->szDriverIdent[0xe] = '\0';
    __ptr->szDriverIdent[0xf] = '\0';
    tcStorage_01 = extraout_RDX;
  }
  else {
    iVar1 = strcasecmp(__s1,"-eg20t");
    if (iVar1 == 0) {
      __ptr = (EC_T_LINK_PARMS *)calloc(1,0x40);
      if (__ptr == (EC_T_LINK_PARMS *)0x0) {
        return 0x9811000a;
      }
      __ptr->dwSignature = 0xba12cb01;
      __ptr->dwSize = 0x40;
      builtin_memcpy(__ptr->szDriverIdent,"EG20T",6);
      __ptr->szDriverIdent[6] = '\0';
      __ptr->szDriverIdent[7] = '\0';
      __ptr->szDriverIdent[8] = '\0';
      __ptr->szDriverIdent[9] = '\0';
      __ptr->szDriverIdent[10] = '\0';
      __ptr->szDriverIdent[0xb] = '\0';
      __ptr->szDriverIdent[0xc] = '\0';
      __ptr->szDriverIdent[0xd] = '\0';
      __ptr->szDriverIdent[0xe] = '\0';
      __ptr->szDriverIdent[0xf] = '\0';
      tcStorage_01 = extraout_RDX_00;
    }
    else {
      iVar1 = strcasecmp(__s1,"-i8254x");
      if (iVar1 == 0) {
        __ptr = (EC_T_LINK_PARMS *)calloc(1,0x50);
        if (__ptr == (EC_T_LINK_PARMS *)0x0) {
          return 0x9811000a;
        }
        __ptr->dwSignature = 0xba12ca31;
        __ptr->dwSize = 0x50;
        builtin_memcpy(__ptr->szDriverIdent,"I8254x",7);
        __ptr->szDriverIdent[7] = '\0';
        __ptr->szDriverIdent[8] = '\0';
        __ptr->szDriverIdent[9] = '\0';
        __ptr->szDriverIdent[10] = '\0';
        __ptr->szDriverIdent[0xb] = '\0';
        __ptr->szDriverIdent[0xc] = '\0';
        __ptr->szDriverIdent[0xd] = '\0';
        __ptr->szDriverIdent[0xe] = '\0';
        __ptr->szDriverIdent[0xf] = '\0';
        tcStorage_01 = extraout_RDX_01;
      }
      else {
        iVar1 = strcasecmp(__s1,"-i8255x");
        if (iVar1 == 0) {
          __ptr = (EC_T_LINK_PARMS *)calloc(1,0x40);
          if (__ptr == (EC_T_LINK_PARMS *)0x0) {
            return 0x9811000a;
          }
          __ptr->dwSignature = 0xba12ca21;
          __ptr->dwSize = 0x40;
          builtin_memcpy(__ptr->szDriverIdent,"I8255x",7);
          __ptr->szDriverIdent[7] = '\0';
          __ptr->szDriverIdent[8] = '\0';
          __ptr->szDriverIdent[9] = '\0';
          __ptr->szDriverIdent[10] = '\0';
          __ptr->szDriverIdent[0xb] = '\0';
          __ptr->szDriverIdent[0xc] = '\0';
          __ptr->szDriverIdent[0xd] = '\0';
          __ptr->szDriverIdent[0xe] = '\0';
          __ptr->szDriverIdent[0xf] = '\0';
          tcStorage_01 = extraout_RDX_02;
        }
        else {
          iVar1 = strcasecmp(__s1,"-r6040");
          if (iVar1 == 0) {
            __ptr = (EC_T_LINK_PARMS *)calloc(1,0x40);
            if (__ptr == (EC_T_LINK_PARMS *)0x0) {
              return 0x9811000a;
            }
            __ptr->dwSignature = 0xba12cb11;
            __ptr->dwSize = 0x40;
            builtin_memcpy(__ptr->szDriverIdent,"R6040",6);
            __ptr->szDriverIdent[6] = '\0';
            __ptr->szDriverIdent[7] = '\0';
            __ptr->szDriverIdent[8] = '\0';
            __ptr->szDriverIdent[9] = '\0';
            __ptr->szDriverIdent[10] = '\0';
            __ptr->szDriverIdent[0xb] = '\0';
            __ptr->szDriverIdent[0xc] = '\0';
            __ptr->szDriverIdent[0xd] = '\0';
            __ptr->szDriverIdent[0xe] = '\0';
            __ptr->szDriverIdent[0xf] = '\0';
            tcStorage_01 = extraout_RDX_03;
          }
          else {
            iVar1 = strcasecmp(__s1,"-rtl8139");
            if (iVar1 != 0) {
              pbGetNextWord_00 = ppLinkParms;
              EVar2 = CreateLinkParmsFromCmdLineRTL8169
                                (ptcWord,lpCmdLine,tcStorage,(EC_T_BOOL *)ppLinkParms,ppLinkParms_00
                                );
              if (EVar2 == 0x9811000c) {
                EVar2 = CreateLinkParmsFromCmdLineSockRaw
                                  (ptcWord,(EC_T_CHAR **)ppLinkParms,tcStorage_00,
                                   (EC_T_BOOL *)pbGetNextWord_00,ppLinkParms_00);
                return EVar2;
              }
              return EVar2;
            }
            __ptr = (EC_T_LINK_PARMS *)calloc(1,0x48);
            if (__ptr == (EC_T_LINK_PARMS *)0x0) {
              return 0x9811000a;
            }
            __ptr->dwSignature = 0xba12ca41;
            __ptr->dwSize = 0x48;
            builtin_memcpy(__ptr->szDriverIdent,"RTL8139",8);
            __ptr->szDriverIdent[8] = '\0';
            __ptr->szDriverIdent[9] = '\0';
            __ptr->szDriverIdent[10] = '\0';
            __ptr->szDriverIdent[0xb] = '\0';
            __ptr->szDriverIdent[0xc] = '\0';
            __ptr->szDriverIdent[0xd] = '\0';
            __ptr->szDriverIdent[0xe] = '\0';
            __ptr->szDriverIdent[0xf] = '\0';
            tcStorage_01 = extraout_RDX_04;
          }
        }
      }
    }
  }
  __ptr->szDriverIdent[0x10] = '\0';
  __ptr->szDriverIdent[0x11] = '\0';
  __ptr->szDriverIdent[0x12] = '\0';
  __ptr->szDriverIdent[0x13] = '\0';
  __ptr->szDriverIdent[0x14] = '\0';
  __ptr->szDriverIdent[0x15] = '\0';
  __ptr->szDriverIdent[0x16] = '\0';
  __ptr->szDriverIdent[0x17] = '\0';
  __ptr->szDriverIdent[0x18] = '\0';
  __ptr->szDriverIdent[0x19] = '\0';
  __ptr->szDriverIdent[0x1a] = '\0';
  __ptr->szDriverIdent[0x1b] = '\0';
  __ptr->szDriverIdent[0x1c] = '\0';
  __ptr->szDriverIdent[0x1d] = '\0';
  __ptr->szDriverIdent[0x1e] = '\0';
  __ptr->szDriverIdent[0x1f] = '\0';
  __ptr->szDriverIdent[0x1f] = '\0';
  __ptr->szDriverIdent[0x20] = '\0';
  __ptr->szDriverIdent[0x21] = '\0';
  __ptr->szDriverIdent[0x22] = '\0';
  __ptr->szDriverIdent[0x23] = '\0';
  __ptr->szDriverIdent[0x24] = '\0';
  __ptr->szDriverIdent[0x25] = '\0';
  __ptr->szDriverIdent[0x26] = '\0';
  lpCmdLine_00 = &__ptr->dwInstance;
  __ptr->dwInstance = 1;
  __ptr->eLinkMode = EcLinkMode_POLLING;
  EVar3 = ParseDword(ptcWord,(EC_T_CHAR **)lpCmdLine_00,tcStorage_01,(EC_T_DWORD *)pbGetNextWord);
  if ((EVar3 != 0) &&
     (EVar3 = ParseLinkMode(ptcWord,(EC_T_CHAR **)lpCmdLine_00,tcStorage_02,&__ptr->eLinkMode),
     EVar3 != 0)) {
    *ppLinkParms = __ptr;
    return 0;
  }
  free(__ptr);
  return 0x9811000b;
}

Assistant:

EC_T_DWORD CreateLinkParmsFromCmdLine
(   EC_T_CHAR**     ptcWord,
    EC_T_CHAR**     lpCmdLine,
    EC_T_CHAR*      tcStorage,
    EC_T_BOOL*      pbGetNextWord,  /* [out]  Shows that next parameter should be read or not */
    EC_T_LINK_PARMS** ppLinkParms
)
{
EC_T_DWORD dwRetVal = EC_E_NOTFOUND;

#if (defined INCLUDE_CCAT)
    dwRetVal = CreateLinkParmsFromCmdLineCCAT(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EG20T)
    dwRetVal = CreateLinkParmsFromCmdLineEG20T(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_CPSW)
    dwRetVal = CreateLinkParmsFromCmdLineCPSW(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EMAC)
    dwRetVal = CreateLinkParmsFromCmdLineEMAC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ETSEC)
    dwRetVal = CreateLinkParmsFromCmdLineETSEC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_FSLFEC)
    dwRetVal = CreateLinkParmsFromCmdLineFslFec(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_GEM)
    dwRetVal = CreateLinkParmsFromCmdLineGEM(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8254X)
    dwRetVal = CreateLinkParmsFromCmdLineI8254x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8255X)
    dwRetVal = CreateLinkParmsFromCmdLineI8255x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ICSS)
    dwRetVal = CreateLinkParmsFromCmdLineICSS(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_L9218I)
    dwRetVal = CreateLinkParmsFromCmdLineL9218i(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_NDISUIO)
    dwRetVal = CreateLinkParmsFromCmdLineNDISUIO(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_PXAMFU)
    dwRetVal = CreateLinkParmsFromCmdLinePXAMFU(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_R6040)
    dwRetVal = CreateLinkParmsFromCmdLineR6040(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RIN32M3)
    dwRetVal = CreateLinkParmsFromCmdLineRIN32M3(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8139)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8139(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8169)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8169(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RZT1)
    dwRetVal = CreateLinkParmsFromCmdLineRZT1(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SNARF)
    dwRetVal = CreateLinkParmsFromCmdLineSnarf(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SHETH)
    dwRetVal = CreateLinkParmsFromCmdLineSHEth(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SOCKRAW)
    dwRetVal = CreateLinkParmsFromCmdLineSockRaw(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_WINPCAP)
    dwRetVal = CreateLinkParmsFromCmdLineWinPcap(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DW3504)
    dwRetVal = CreateLinkParmsFromCmdLineDW3504(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DUMMY)
    dwRetVal = CreateLinkParmsFromCmdLineDummy(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
Exit:
    return dwRetVal;
}